

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

bool ApplicativeHelper::isSafe(TermStack *args)

{
  bool bVar1;
  TermList *this;
  TermList *pTVar2;
  Stack<Kernel::TermList> *in_RDI;
  TermList head;
  TermList ithArg;
  uint i;
  TermList in_stack_ffffffffffffffb8;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    this = (TermList *)(ulong)local_14;
    pTVar2 = (TermList *)Lib::Stack<Kernel::TermList>::size(in_RDI);
    if (pTVar2 <= this) {
      return true;
    }
    Lib::Stack<Kernel::TermList>::operator[](in_RDI,(ulong)local_14);
    getHead(in_stack_ffffffffffffffb8);
    bVar1 = isComb(in_stack_ffffffffffffffb8);
    if ((bVar1) || (bVar1 = Kernel::TermList::isVar(this), bVar1)) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool ApplicativeHelper::isSafe(TermStack& args)
{
  for(unsigned i = 0; i < args.size(); i++){
    TermList ithArg = args[i];
    /*if(ithArg.isVar() || !ithArg.term()->ground()){
      return false;
    }*/
    TermList head = getHead(ithArg);
    if(isComb(head) || head.isVar()){
      return false;
    }
  }
  return true;
}